

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_crg_dumpparms(jpc_ms_t *ms,FILE *out)

{
  jpc_crgcomp_t *local_30;
  jpc_crgcomp_t *comp;
  int compno;
  jpc_crg_t *crg;
  FILE *out_local;
  jpc_ms_t *ms_local;
  
  comp._4_4_ = 0;
  local_30 = (ms->parms).crg.comps;
  for (; (int)comp._4_4_ < (ms->parms).soc; comp._4_4_ = comp._4_4_ + 1) {
    fprintf((FILE *)out,"hoff[%d] = %lu; voff[%d] = %lu\n",(ulong)comp._4_4_,local_30->hoff,
            (ulong)comp._4_4_,local_30->voff);
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

static int jpc_crg_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_crg_t *crg = &ms->parms.crg;
	int compno;
	jpc_crgcomp_t *comp;
	for (compno = 0, comp = crg->comps; compno < crg->numcomps; ++compno,
	  ++comp) {
		fprintf(out, "hoff[%d] = %"PRIuFAST16"; voff[%d] = %"PRIuFAST16"\n",
		  compno, comp->hoff, compno, comp->voff);
	}
	return 0;
}